

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::
InternalSwap(RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight> *this,
            RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight> *other)

{
  RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight> *other_local;
  RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }